

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void igSetNextWindowPos(ImVec2 pos,ImGuiCond cond,ImVec2 pivot)

{
  ImVec2 IStack_18;
  ImGuiCond cond_local;
  ImVec2 pivot_local;
  ImVec2 pos_local;
  
  IStack_18 = pivot;
  pivot_local = pos;
  ImGui::SetNextWindowPos(&pivot_local,cond,&stack0xffffffffffffffe8);
  return;
}

Assistant:

CIMGUI_API void _igSetNextWindowPos (ImVec2 const *larg1, ImGuiCond arg2, ImVec2 const *larg3) {
  ImVec2 arg1 ;
  ImVec2 arg3 ;
  
  arg1 = *larg1;
  arg3 = *larg3;
  try {
    igSetNextWindowPos(arg1,arg2,arg3);
    
  } catch (...) {
    
  }
}